

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes3InfoTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::RenderTargetInfoCase::iterate(RenderTargetInfoCase *this)

{
  TestLog *pTVar1;
  RenderTarget *pRVar2;
  string *psVar3;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  int __fd;
  allocator<char> local_783;
  allocator<char> local_782;
  allocator<char> local_781;
  allocator<char> local_780;
  allocator<char> local_77f;
  allocator<char> local_77e;
  allocator<char> local_77d;
  allocator<char> local_77c;
  allocator<char> local_77b;
  allocator<char> local_77a;
  allocator<char> local_779;
  allocator<char> local_778;
  allocator<char> local_777;
  allocator<char> local_776;
  allocator<char> local_775;
  allocator<char> local_774;
  allocator<char> local_773;
  allocator<char> local_772;
  allocator<char> local_771;
  allocator<char> local_770;
  allocator<char> local_76f;
  allocator<char> local_76e;
  allocator<char> local_76d;
  allocator<char> local_76c;
  allocator<char> local_76b;
  allocator<char> local_76a;
  allocator<char> local_769;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  LogNumber<long> local_408;
  LogNumber<long> local_398;
  LogNumber<long> local_328;
  LogNumber<long> local_2b8;
  LogNumber<long> local_248;
  LogNumber<long> local_1d8;
  LogNumber<long> local_168;
  LogNumber<long> local_f8;
  LogNumber<long> local_88;
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"RedBits",&local_769);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"Red channel bits",&local_76a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,glcts::fixed_sample_locations_values + 1,&local_76b);
  psVar3 = &local_468;
  tcu::LogNumber<long>::LogNumber
            (&local_88,&local_428,&local_448,psVar3,QP_KEY_TAG_NONE,
             (long)(pRVar2->m_pixelFormat).redBits);
  __fd = (int)pTVar1;
  tcu::LogNumber<long>::write(&local_88,__fd,__buf,(size_t)psVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"GreenBits",&local_76c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"Green channel bits",&local_76d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,glcts::fixed_sample_locations_values + 1,&local_76e);
  psVar3 = &local_4c8;
  tcu::LogNumber<long>::LogNumber
            (&local_f8,&local_488,&local_4a8,psVar3,QP_KEY_TAG_NONE,
             (long)(pRVar2->m_pixelFormat).greenBits);
  tcu::LogNumber<long>::write(&local_f8,__fd,__buf_00,(size_t)psVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"BlueBits",&local_76f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"Blue channel bits",&local_770);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,glcts::fixed_sample_locations_values + 1,&local_771);
  psVar3 = &local_528;
  tcu::LogNumber<long>::LogNumber
            (&local_168,&local_4e8,&local_508,psVar3,QP_KEY_TAG_NONE,
             (long)(pRVar2->m_pixelFormat).blueBits);
  tcu::LogNumber<long>::write(&local_168,__fd,__buf_01,(size_t)psVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"AlphaBits",&local_772);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"Alpha channel bits",&local_773);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,glcts::fixed_sample_locations_values + 1,&local_774);
  psVar3 = &local_588;
  tcu::LogNumber<long>::LogNumber
            (&local_1d8,&local_548,&local_568,psVar3,QP_KEY_TAG_NONE,
             (long)(pRVar2->m_pixelFormat).alphaBits);
  tcu::LogNumber<long>::write(&local_1d8,__fd,__buf_02,(size_t)psVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"DepthBits",&local_775);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"Depth bits",&local_776);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,glcts::fixed_sample_locations_values + 1,&local_777);
  psVar3 = &local_5e8;
  tcu::LogNumber<long>::LogNumber
            (&local_248,&local_5a8,&local_5c8,psVar3,QP_KEY_TAG_NONE,(long)pRVar2->m_depthBits);
  tcu::LogNumber<long>::write(&local_248,__fd,__buf_03,(size_t)psVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"StencilBits",&local_778);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"Stencil bits",&local_779)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,glcts::fixed_sample_locations_values + 1,&local_77a);
  psVar3 = &local_648;
  tcu::LogNumber<long>::LogNumber
            (&local_2b8,&local_608,&local_628,psVar3,QP_KEY_TAG_NONE,(long)pRVar2->m_stencilBits);
  tcu::LogNumber<long>::write(&local_2b8,__fd,__buf_04,(size_t)psVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"NumSamples",&local_77b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,"Number of samples",&local_77c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,glcts::fixed_sample_locations_values + 1,&local_77d);
  psVar3 = &local_6a8;
  tcu::LogNumber<long>::LogNumber
            (&local_328,&local_668,&local_688,psVar3,QP_KEY_TAG_NONE,(long)pRVar2->m_numSamples);
  tcu::LogNumber<long>::write(&local_328,__fd,__buf_05,(size_t)psVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"Width",&local_77e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"Width",&local_77f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,glcts::fixed_sample_locations_values + 1,&local_780);
  psVar3 = &local_708;
  tcu::LogNumber<long>::LogNumber
            (&local_398,&local_6c8,&local_6e8,psVar3,QP_KEY_TAG_NONE,(long)pRVar2->m_width);
  tcu::LogNumber<long>::write(&local_398,__fd,__buf_06,(size_t)psVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"Height",&local_781);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"Height",&local_782);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,glcts::fixed_sample_locations_values + 1,&local_783);
  psVar3 = &local_768;
  tcu::LogNumber<long>::LogNumber
            (&local_408,&local_728,&local_748,psVar3,QP_KEY_TAG_NONE,(long)pRVar2->m_height);
  tcu::LogNumber<long>::write(&local_408,__fd,__buf_07,(size_t)psVar3);
  tcu::LogNumber<long>::~LogNumber(&local_408);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_728);
  tcu::LogNumber<long>::~LogNumber(&local_398);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  tcu::LogNumber<long>::~LogNumber(&local_328);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_668);
  tcu::LogNumber<long>::~LogNumber(&local_2b8);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  tcu::LogNumber<long>::~LogNumber(&local_248);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5a8);
  tcu::LogNumber<long>::~LogNumber(&local_1d8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  tcu::LogNumber<long>::~LogNumber(&local_168);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  tcu::LogNumber<long>::~LogNumber(&local_f8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_488);
  tcu::LogNumber<long>::~LogNumber(&local_88);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_428);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const tcu::RenderTarget&	rt		= m_context.getRenderTarget();
		const tcu::PixelFormat&		pf		= rt.getPixelFormat();

		m_testCtx.getLog()
			<< tcu::TestLog::Integer("RedBits",		"Red channel bits",		"", QP_KEY_TAG_NONE,	pf.redBits)
			<< tcu::TestLog::Integer("GreenBits",	"Green channel bits",	"",	QP_KEY_TAG_NONE,	pf.greenBits)
			<< tcu::TestLog::Integer("BlueBits",	"Blue channel bits",	"",	QP_KEY_TAG_NONE,	pf.blueBits)
			<< tcu::TestLog::Integer("AlphaBits",	"Alpha channel bits",	"",	QP_KEY_TAG_NONE,	pf.alphaBits)
			<< tcu::TestLog::Integer("DepthBits",	"Depth bits",			"",	QP_KEY_TAG_NONE,	rt.getDepthBits())
			<< tcu::TestLog::Integer("StencilBits",	"Stencil bits",			"",	QP_KEY_TAG_NONE,	rt.getStencilBits())
			<< tcu::TestLog::Integer("NumSamples",	"Number of samples",	"",	QP_KEY_TAG_NONE,	rt.getNumSamples())
			<< tcu::TestLog::Integer("Width",		"Width",				"",	QP_KEY_TAG_NONE,	rt.getWidth())
			<< tcu::TestLog::Integer("Height",		"Height",				"",	QP_KEY_TAG_NONE,	rt.getHeight());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}